

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArchiveProxy.cpp
# Opt level: O3

bool __thiscall
aeron::archive::ArchiveProxy::getStopPosition
          (ArchiveProxy *this,int64_t recordingId,int64_t correlationId,int64_t controlSessionId)

{
  bool bVar1;
  StopPositionRequest *pSVar2;
  int64_t val;
  int64_t val_1;
  int64_t val_2;
  StopPositionRequest msg;
  StopPositionRequest local_68;
  
  local_68.m_offset = 0;
  local_68.m_buffer = (char *)0x0;
  local_68.m_bufferLength = 0;
  pSVar2 = wrapAndApplyHeader<io::aeron::archive::codecs::StopPositionRequest>(this,&local_68);
  *(int64_t *)(pSVar2->m_buffer + pSVar2->m_offset) = controlSessionId;
  *(int64_t *)(pSVar2->m_buffer + pSVar2->m_offset + 8) = correlationId;
  *(int64_t *)(pSVar2->m_buffer + pSVar2->m_offset + 0x10) = recordingId;
  bVar1 = offer(this,(int)local_68.m_position - (int)local_68.m_offset);
  return bVar1;
}

Assistant:

bool ArchiveProxy::getStopPosition(std::int64_t recordingId, std::int64_t correlationId, std::int64_t controlSessionId)
{
    codecs::StopPositionRequest msg;

    wrapAndApplyHeader(msg)
        .controlSessionId(controlSessionId)
        .correlationId(correlationId)
        .recordingId(recordingId);

    return offer(msg.encodedLength());
}